

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_96ee67::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,double value,double total,string *status)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  ostringstream oss;
  long *local_1b0 [2];
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  if (0.0 < total) {
    iVar1 = this->CurrentPercentage;
    iVar3 = (int)((value / total) * 100.0 + 0.5);
    iVar4 = 100;
    if (iVar3 < 100) {
      iVar4 = iVar3;
    }
    this->CurrentPercentage = iVar4;
    if (iVar1 != iVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[",1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,(this->Text)._M_dataplus._M_p,
                          (this->Text)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->CurrentPercentage);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"% complete]",0xb);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)status,(string *)local_1b0);
      if (local_1b0[0] != local_1a0) {
        operator_delete(local_1b0[0],local_1a0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
      std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
      return true;
    }
  }
  return false;
}

Assistant:

bool UpdatePercentage(double value, double total, std::string &status)
      {
      int OldPercentage = this->CurrentPercentage;

      if (total > 0.0)
        {
        this->CurrentPercentage = static_cast<int>(value/total*100.0 + 0.5);
        if(this->CurrentPercentage > 100)
          {
          // Avoid extra progress reports for unexpected data beyond total.
          this->CurrentPercentage = 100;
          }
        }

      bool updated = (OldPercentage != this->CurrentPercentage);

      if (updated)
        {
        std::ostringstream oss;
        oss << "[" << this->Text << " " << this->CurrentPercentage
            << "% complete]";
        status = oss.str();
        }

      return updated;
      }